

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcCore.c
# Opt level: O3

void Bdc_ManDecPrint_rec(Bdc_Man_t *p,Bdc_Fun_t *pNode)

{
  Bdc_Fun_t *pBVar1;
  int __c;
  
  do {
    if (pNode->Type != 3) {
      if (pNode->Type != 2) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/bdc/bdcCore.c"
                      ,0x102,"void Bdc_ManDecPrint_rec(Bdc_Man_t *, Bdc_Fun_t *)");
      }
      __c = (int)((ulong)((long)pNode - (long)p->pNodes) >> 3) * -0x49249249 + 0x60;
      goto LAB_0054cf8b;
    }
    pBVar1 = pNode->pFan0;
    pNode = pNode->pFan1;
    if (((ulong)pBVar1 & 1) == 0) {
      Bdc_ManDecPrint_rec(p,pBVar1);
    }
    else {
      putchar(0x21);
      pBVar1 = (Bdc_Fun_t *)((ulong)pBVar1 & 0xfffffffffffffffe);
      if (pBVar1->Type != 2) {
        putchar(0x28);
      }
      Bdc_ManDecPrint_rec(p,pBVar1);
      if (pBVar1->Type != 2) {
        putchar(0x29);
      }
    }
  } while (((ulong)pNode & 1) == 0);
  putchar(0x21);
  pBVar1 = (Bdc_Fun_t *)((ulong)pNode & 0xfffffffffffffffe);
  if (pBVar1->Type != 2) {
    putchar(0x28);
  }
  Bdc_ManDecPrint_rec(p,pBVar1);
  __c = 0x29;
  if (pBVar1->Type == 2) {
    return;
  }
LAB_0054cf8b:
  putchar(__c);
  return;
}

Assistant:

void Bdc_ManDecPrint_rec( Bdc_Man_t * p, Bdc_Fun_t * pNode )
{
    if ( pNode->Type == BDC_TYPE_PI )
        printf( "%c", 'a' + Bdc_FunId(p,pNode) - 1 );
    else if ( pNode->Type == BDC_TYPE_AND )
    {
        Bdc_Fun_t * pNode0 = Bdc_FuncFanin0( pNode );
        Bdc_Fun_t * pNode1 = Bdc_FuncFanin1( pNode );

        if ( Bdc_IsComplement(pNode0) )
            printf( "!" );
        if ( Bdc_IsComplement(pNode0) && Bdc_Regular(pNode0)->Type != BDC_TYPE_PI )
            printf( "(" );
        Bdc_ManDecPrint_rec( p, Bdc_Regular(pNode0) );
        if ( Bdc_IsComplement(pNode0) && Bdc_Regular(pNode0)->Type != BDC_TYPE_PI )
            printf( ")" );

        if ( Bdc_IsComplement(pNode1) )
            printf( "!" );
        if ( Bdc_IsComplement(pNode1) && Bdc_Regular(pNode1)->Type != BDC_TYPE_PI )
            printf( "(" );
        Bdc_ManDecPrint_rec( p, Bdc_Regular(pNode1) );
        if ( Bdc_IsComplement(pNode1) && Bdc_Regular(pNode1)->Type != BDC_TYPE_PI )
            printf( ")" );
    }
    else assert( 0 );
}